

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3EvalNextRow(Fts3Cursor *pCsr,Fts3Expr *pExpr,int *pRc)

{
  int *piVar1;
  u8 uVar2;
  u8 uVar3;
  Fts3Expr *pFVar4;
  Fts3Expr *pFVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  sqlite3_int64 sVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  TokenDoclist *p;
  char **ppcVar17;
  Fts3Expr *pFVar18;
  ulong uVar19;
  Fts3Expr *pExpr_00;
  Fts3Phrase *pFVar20;
  bool bVar21;
  u8 bEof;
  char *pR;
  char *pL;
  TokenDoclist a [4];
  u8 local_10b;
  char local_10a;
  u8 local_109;
  int *local_108;
  Fts3Expr *local_100;
  char *local_f8;
  ulong local_f0;
  Fts3Phrase *local_e8;
  Fts3Table *local_e0;
  char *local_d8;
  u8 *local_d0;
  char *local_c8 [2];
  TokenDoclist local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (*pRc != 0) {
    return;
  }
  uVar2 = pCsr->bDesc;
  pExpr->bStart = '\x01';
  local_108 = pRc;
  local_100 = pExpr;
  switch(pExpr->eType) {
  case 1:
  case 3:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    if (pFVar4->bDeferred != '\0') {
      fts3EvalNextRow(pCsr,pFVar5,pRc);
      pExpr->iDocid = pFVar5->iDocid;
      pExpr->bEof = pFVar5->bEof;
      return;
    }
    uVar3 = pFVar5->bDeferred;
    fts3EvalNextRow(pCsr,pFVar4,pRc);
    if (uVar3 != '\0') {
      local_100->iDocid = pFVar4->iDocid;
      local_100->bEof = pFVar4->bEof;
      return;
    }
    fts3EvalNextRow(pCsr,pFVar5,pRc);
    pFVar18 = local_100;
    while ((((piVar1 = local_108, pFVar4->bEof == '\0' && (pFVar5->bEof == '\0')) &&
            (*local_108 == 0)) && (lVar10 = pFVar4->iDocid - pFVar5->iDocid, lVar10 != 0))) {
      lVar12 = -lVar10;
      if (uVar2 == '\0') {
        lVar12 = lVar10;
      }
      pExpr_00 = pFVar4;
      if (-1 < lVar12) {
        pExpr_00 = pFVar5;
      }
      fts3EvalNextRow(pCsr,pExpr_00,local_108);
    }
    pFVar18->iDocid = pFVar4->iDocid;
    bVar21 = true;
    if (pFVar4->bEof == '\0') {
      bVar21 = pFVar5->bEof != '\0';
    }
    pFVar18->bEof = bVar21;
    if (pFVar18->eType != 1) {
      return;
    }
    if (bVar21 == false) {
      return;
    }
    pFVar20 = pFVar5->pPhrase;
    if ((pFVar20->doclist).aAll != (char *)0x0) {
      while ((*piVar1 == 0 && (pFVar5->bEof == '\0'))) {
        memset((pFVar20->doclist).pList,0,(long)(pFVar20->doclist).nList);
        fts3EvalNextRow(pCsr,pFVar5,piVar1);
      }
    }
    pFVar20 = pFVar4->pPhrase;
    if (pFVar20 == (Fts3Phrase *)0x0) {
      return;
    }
    if ((pFVar20->doclist).aAll == (char *)0x0) {
      return;
    }
    while( true ) {
      if (*piVar1 != 0) {
        return;
      }
      if (pFVar4->bEof != '\0') break;
      memset((pFVar20->doclist).pList,0,(long)(pFVar20->doclist).nList);
      fts3EvalNextRow(pCsr,pFVar4,piVar1);
    }
    return;
  case 2:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    if (pFVar5->bStart == '\0') {
      fts3EvalNextRow(pCsr,pFVar5,pRc);
    }
    fts3EvalNextRow(pCsr,pFVar4,local_108);
    piVar1 = local_108;
    if ((pFVar4->bEof == '\0') && (*local_108 == 0)) {
      while (pFVar5->bEof == '\0') {
        lVar12 = pFVar4->iDocid - pFVar5->iDocid;
        lVar10 = -lVar12;
        if (uVar2 == '\0') {
          lVar10 = lVar12;
        }
        if ((lVar10 < 1) || (fts3EvalNextRow(pCsr,pFVar5,piVar1), *piVar1 != 0)) break;
      }
    }
    pExpr->iDocid = pFVar4->iDocid;
    pExpr->bEof = pFVar4->bEof;
    return;
  case 4:
    pFVar4 = pExpr->pLeft;
    pFVar5 = pExpr->pRight;
    uVar19 = -(ulong)(uVar2 != '\0') | 1;
    pFVar18 = pFVar4;
    if (pFVar5->bEof == '\0') {
      lVar10 = (pFVar4->iDocid - pFVar5->iDocid) * uVar19;
      if (((pFVar4->bEof != '\0') || (-1 < lVar10)) &&
         ((pFVar18 = pFVar5, pFVar4->bEof == '\0' && (lVar10 < 1)))) {
        fts3EvalNextRow(pCsr,pFVar4,pRc);
      }
    }
    fts3EvalNextRow(pCsr,pFVar18,pRc);
    if (pFVar4->bEof == '\0') {
      bVar21 = false;
    }
    else {
      bVar21 = pFVar5->bEof != '\0';
    }
    local_100->bEof = bVar21;
    if ((pFVar5->bEof != '\0') ||
       ((sVar13 = pFVar5->iDocid, pFVar4->bEof == '\0' &&
        ((long)((pFVar4->iDocid - sVar13) * uVar19) < 0)))) {
      sVar13 = pFVar4->iDocid;
    }
    goto LAB_001bf9ef;
  }
  pFVar20 = pExpr->pPhrase;
  if ((pFVar20->doclist).bFreeList != 0) {
    sqlite3_free((pFVar20->doclist).pList);
  }
  piVar6 = local_108;
  (pFVar20->doclist).pList = (char *)0x0;
  piVar1 = &(pFVar20->doclist).nList;
  (pFVar20->doclist).nList = 0;
  (pFVar20->doclist).bFreeList = 0;
  local_d0 = &pExpr->bEof;
  local_e0 = (Fts3Table *)(pCsr->base).pVtab;
  if (pFVar20->bIncr == 0) {
    if ((pCsr->bDesc == local_e0->bDescIdx) || (iVar14 = (pFVar20->doclist).nAll, iVar14 == 0)) {
      fts3EvalDlPhraseNext(local_e0,&pFVar20->doclist,local_d0);
    }
    else {
      sqlite3Fts3DoclistPrev
                ((uint)local_e0->bDescIdx,(pFVar20->doclist).aAll,iVar14,
                 &(pFVar20->doclist).pNextDocid,&(pFVar20->doclist).iDocid,piVar1,local_d0);
      (pFVar20->doclist).pList = (pFVar20->doclist).pNextDocid;
    }
    local_108 = piVar6;
    iVar14 = 0;
  }
  else {
    local_10b = '\0';
    if (pFVar20->nToken == 1) {
      iVar7 = sqlite3Fts3MsrIncrNext
                        (local_e0,pFVar20->aToken[0].pSegcsr,&(pFVar20->doclist).iDocid,
                         &(pFVar20->doclist).pList,piVar1);
      if ((pFVar20->doclist).pList == (char *)0x0) {
        local_10b = '\x01';
      }
    }
    else {
      local_109 = pCsr->bDesc;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_b8.pList = (char *)0x0;
      local_b8.nList = 0;
      local_b8._28_4_ = 0;
      local_b8.bIgnore = 0;
      local_b8._4_4_ = 0;
      local_b8.iDocid = 0;
      iVar7 = 0;
      local_f0 = -(ulong)(local_109 != '\0') | 1;
      local_e8 = pFVar20;
      do {
        local_10a = local_10b != '\0';
        if ((bool)local_10a) goto LAB_001bf9ce;
        if ((iVar7 == 0) && (p = &local_b8, 0 < pFVar20->nToken)) {
          sVar13 = 0;
          lVar10 = 1;
          bVar21 = false;
          do {
            iVar7 = incrPhraseTokenNext(local_e0,pFVar20,(int)lVar10 + -1,p,&local_10b);
            if (p->bIgnore == 0) {
              if (bVar21) {
                lVar16 = sVar13 - p->iDocid;
                lVar12 = -lVar16;
                if (local_109 == '\0') {
                  lVar12 = lVar16;
                }
                bVar21 = true;
                if (-1 < lVar12) goto LAB_001bf6ef;
              }
              sVar13 = p->iDocid;
              bVar21 = true;
            }
LAB_001bf6ef:
            if ((iVar7 != 0) || (pFVar20->nToken <= lVar10)) break;
            lVar10 = lVar10 + 1;
            p = p + 1;
          } while (local_10b == '\0');
        }
        else {
          sVar13 = 0;
        }
        iVar14 = pFVar20->nToken;
        if (0 < iVar14) {
          iVar8 = 0;
          do {
            if (((iVar7 == 0) && (local_10b == '\0')) &&
               (lVar10 = (long)iVar8, (&local_b8)[lVar10].bIgnore == 0)) {
              lVar16 = ((&local_b8)[lVar10].iDocid - sVar13) * local_f0;
              lVar12 = sVar13;
              while (sVar13 = lVar12, lVar16 < 0) {
                iVar7 = incrPhraseTokenNext(local_e0,pFVar20,iVar8,&local_b8 + lVar10,&local_10b);
                sVar13 = (&local_b8)[lVar10].iDocid;
                iVar14 = 0;
                if ((long)(((&local_b8)[lVar10].iDocid - lVar12) * local_f0) < 1) {
                  sVar13 = lVar12;
                  iVar14 = iVar8;
                }
                iVar8 = iVar14;
                if (((iVar7 != 0) || (local_10b != '\0')) ||
                   (lVar10 = (long)iVar8, (&local_b8)[lVar10].bIgnore != 0)) break;
                lVar12 = sVar13;
                lVar16 = ((&local_b8)[lVar10].iDocid - sVar13) * local_f0;
              }
            }
            iVar8 = iVar8 + 1;
            iVar14 = pFVar20->nToken;
          } while (iVar8 < iVar14);
        }
        if (local_10b == '\0') {
          iVar14 = *(int *)(local_c8 + (long)iVar14 * 4U + 1);
          pcVar11 = (char *)sqlite3_malloc(iVar14 + 8);
          bVar21 = false;
          iVar8 = 0;
          if (pcVar11 == (char *)0x0) {
            iVar14 = 1;
          }
          else {
            local_f8 = pcVar11;
            memcpy(pcVar11,local_c8[(long)pFVar20->nToken * 4],(long)iVar14 + 1);
            pcVar11 = local_f8 + iVar14;
            pcVar11[0] = '\0';
            pcVar11[1] = '\0';
            pcVar11[2] = '\0';
            pcVar11[3] = '\0';
            pcVar11[4] = '\0';
            pcVar11[5] = '\0';
            pcVar11[6] = '\0';
            pcVar11[7] = '\0';
            uVar19 = (ulong)(uint)pFVar20->nToken;
            iVar14 = 0;
            pcVar11 = local_f8;
            if (1 < pFVar20->nToken) {
              lVar10 = 0;
              iVar8 = -1;
              ppcVar17 = &local_b8.pList;
              iVar14 = 0;
              do {
                iVar15 = iVar14;
                if (((TokenDoclist *)(ppcVar17 + -2))->bIgnore == 0) {
                  local_c8[1] = *ppcVar17;
                  local_d8 = pcVar11;
                  local_c8[0] = pcVar11;
                  iVar9 = fts3PoslistPhraseMerge
                                    (&local_d8,(int)uVar19 + iVar8,0,1,local_c8 + 1,local_c8);
                  pcVar11 = local_f8;
                  iVar15 = (int)local_d8 - (int)local_f8;
                  if (iVar9 == 0) break;
                }
                lVar10 = lVar10 + 1;
                uVar19 = (ulong)local_e8->nToken;
                iVar8 = iVar8 + -1;
                ppcVar17 = ppcVar17 + 4;
                iVar14 = iVar15;
              } while (lVar10 < (long)(uVar19 - 1));
              iVar8 = (int)lVar10;
              pFVar20 = local_e8;
            }
            if (iVar8 == pFVar20->nToken + -1) {
              (pFVar20->doclist).iDocid = sVar13;
              (pFVar20->doclist).pList = pcVar11;
              (pFVar20->doclist).nList = iVar14;
              (pFVar20->doclist).bFreeList = 1;
              iVar14 = 3;
              bVar21 = false;
            }
            else {
              sqlite3_free(pcVar11);
              iVar14 = 0;
              bVar21 = true;
            }
          }
          if (bVar21) goto LAB_001bf84d;
        }
        else {
LAB_001bf84d:
          iVar14 = 0;
        }
      } while (iVar14 == 0);
      if (iVar14 == 3) {
        local_10a = '\x01';
      }
LAB_001bf9ce:
      iVar14 = 7;
      if (local_10a == '\0') goto LAB_001bf9e9;
    }
    *local_d0 = local_10b;
    iVar14 = iVar7;
  }
LAB_001bf9e9:
  *local_108 = iVar14;
  sVar13 = (pFVar20->doclist).iDocid;
LAB_001bf9ef:
  local_100->iDocid = sVar13;
  return;
}

Assistant:

static void fts3EvalNextRow(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pExpr,                /* Expr. to advance to next matching row */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    int bDescDoclist = pCsr->bDesc;         /* Used by DOCID_CMP() macro */
    assert( pExpr->bEof==0 );
    pExpr->bStart = 1;

    switch( pExpr->eType ){
      case FTSQUERY_NEAR:
      case FTSQUERY_AND: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        assert( !pLeft->bDeferred || !pRight->bDeferred );

        if( pLeft->bDeferred ){
          /* LHS is entirely deferred. So we assume it matches every row.
          ** Advance the RHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pRight, pRc);
          pExpr->iDocid = pRight->iDocid;
          pExpr->bEof = pRight->bEof;
        }else if( pRight->bDeferred ){
          /* RHS is entirely deferred. So we assume it matches every row.
          ** Advance the LHS iterator to find the next row visited. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = pLeft->bEof;
        }else{
          /* Neither the RHS or LHS are deferred. */
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
          while( !pLeft->bEof && !pRight->bEof && *pRc==SQLITE_OK ){
            sqlite3_int64 iDiff = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
            if( iDiff==0 ) break;
            if( iDiff<0 ){
              fts3EvalNextRow(pCsr, pLeft, pRc);
            }else{
              fts3EvalNextRow(pCsr, pRight, pRc);
            }
          }
          pExpr->iDocid = pLeft->iDocid;
          pExpr->bEof = (pLeft->bEof || pRight->bEof);
          if( pExpr->eType==FTSQUERY_NEAR && pExpr->bEof ){
            assert( pRight->eType==FTSQUERY_PHRASE );
            if( pRight->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pRight->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pRight->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pRight, pRc);
              }
            }
            if( pLeft->pPhrase && pLeft->pPhrase->doclist.aAll ){
              Fts3Doclist *pDl = &pLeft->pPhrase->doclist;
              while( *pRc==SQLITE_OK && pLeft->bEof==0 ){
                memset(pDl->pList, 0, pDl->nList);
                fts3EvalNextRow(pCsr, pLeft, pRc);
              }
            }
          }
        }
        break;
      }
  
      case FTSQUERY_OR: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;
        sqlite3_int64 iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);

        assert( pLeft->bStart || pLeft->iDocid==pRight->iDocid );
        assert( pRight->bStart || pLeft->iDocid==pRight->iDocid );

        if( pRight->bEof || (pLeft->bEof==0 && iCmp<0) ){
          fts3EvalNextRow(pCsr, pLeft, pRc);
        }else if( pLeft->bEof || iCmp>0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
        }else{
          fts3EvalNextRow(pCsr, pLeft, pRc);
          fts3EvalNextRow(pCsr, pRight, pRc);
        }

        pExpr->bEof = (pLeft->bEof && pRight->bEof);
        iCmp = DOCID_CMP(pLeft->iDocid, pRight->iDocid);
        if( pRight->bEof || (pLeft->bEof==0 &&  iCmp<0) ){
          pExpr->iDocid = pLeft->iDocid;
        }else{
          pExpr->iDocid = pRight->iDocid;
        }

        break;
      }

      case FTSQUERY_NOT: {
        Fts3Expr *pLeft = pExpr->pLeft;
        Fts3Expr *pRight = pExpr->pRight;

        if( pRight->bStart==0 ){
          fts3EvalNextRow(pCsr, pRight, pRc);
          assert( *pRc!=SQLITE_OK || pRight->bStart );
        }

        fts3EvalNextRow(pCsr, pLeft, pRc);
        if( pLeft->bEof==0 ){
          while( !*pRc 
              && !pRight->bEof 
              && DOCID_CMP(pLeft->iDocid, pRight->iDocid)>0 
          ){
            fts3EvalNextRow(pCsr, pRight, pRc);
          }
        }
        pExpr->iDocid = pLeft->iDocid;
        pExpr->bEof = pLeft->bEof;
        break;
      }

      default: {
        Fts3Phrase *pPhrase = pExpr->pPhrase;
        fts3EvalInvalidatePoslist(pPhrase);
        *pRc = fts3EvalPhraseNext(pCsr, pPhrase, &pExpr->bEof);
        pExpr->iDocid = pPhrase->doclist.iDocid;
        break;
      }
    }
  }
}